

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

void test_iterate(void)

{
  bitset_t *pbVar1;
  uint64_t *puVar2;
  _Bool _Var3;
  bitset_t *pbVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  short sVar8;
  undefined1 *puVar9;
  long lVar10;
  long lVar11;
  bitset_t *pbVar12;
  long lVar13;
  ulong uVar14;
  short sVar15;
  bitset_t *in_RSI;
  bitset_t *pbVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t uVar19;
  uint64_t unaff_R13;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong auStack_220 [5];
  bitset_t *pbStack_1f8;
  bitset_t *pbStack_1f0;
  code *pcStack_1e8;
  bitset_t *pbStack_1d8;
  undefined8 uStack_1d0;
  bitset_t *pbStack_1c8;
  code *pcStack_1c0;
  bitset_t *pbStack_1b0;
  bitset_t *pbStack_1a8;
  bitset_t *pbStack_1a0;
  ulong uStack_198;
  ulong uStack_190;
  bitset_t *pbStack_188;
  code *pcStack_180;
  bitset_t *pbStack_178;
  long lStack_170;
  ulong uStack_168;
  bitset_t *pbStack_160;
  code *pcStack_158;
  bitset_t *pbStack_148;
  ulong uStack_140;
  ulong uStack_138;
  bitset_t *pbStack_130;
  long lStack_128;
  code *pcStack_120;
  size_t sStack_118;
  long lStack_110;
  long lStack_108;
  bitset_t *pbStack_100;
  code *pcStack_f8;
  size_t sStack_f0;
  bitset_t *pbStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  bitset_t *pbStack_d0;
  size_t sStack_c8;
  long lStack_50;
  bitset_t *pbStack_48;
  
  uVar21 = 0;
  pbVar4 = bitset_create();
  do {
    uVar23 = uVar21 >> 6;
    if (uVar23 < pbVar4->arraysize) {
LAB_001018f9:
      pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)uVar21 & 0x3f);
    }
    else {
      in_RSI = (bitset_t *)(uVar23 + 1);
      _Var3 = bitset_grow(pbVar4,(size_t)in_RSI);
      if (_Var3) goto LAB_001018f9;
    }
    uVar21 = uVar21 + 3;
  } while (uVar21 != 3000);
  pbVar16 = pbVar4;
  sVar5 = bitset_count(pbVar4);
  if (sVar5 == 1000) {
    pbVar12 = (bitset_t *)pbVar4->arraysize;
    if (pbVar12 != (bitset_t *)0x0) {
      pbVar16 = (bitset_t *)0x0;
      puVar9 = (undefined1 *)0x0;
      in_RSI = (bitset_t *)0x0;
      do {
        uVar21 = pbVar4->array[(long)pbVar16] >> ((byte)puVar9 & 0x3f);
        if (uVar21 == 0) {
          lVar10 = (long)pbVar16 * -0x40;
          do {
            pbVar16 = (bitset_t *)((long)&pbVar16->array + 1);
            if (pbVar12 == pbVar16) goto LAB_001019a3;
            uVar21 = pbVar4->array[(long)pbVar16];
            lVar10 = lVar10 + -0x40;
          } while (uVar21 == 0);
          lVar20 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          pbVar16 = (bitset_t *)(lVar20 - lVar10);
        }
        else {
          lVar10 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          pbVar16 = (bitset_t *)(puVar9 + lVar10);
        }
        if (pbVar16 != in_RSI) {
          test_iterate_cold_2();
          goto LAB_001019be;
        }
        pbVar1 = (bitset_t *)((long)&in_RSI->array + 3);
        puVar9 = (undefined1 *)((long)&in_RSI->array + 1);
        pbVar16 = (bitset_t *)((ulong)puVar9 >> 6);
        in_RSI = pbVar1;
      } while (pbVar16 < pbVar12);
LAB_001019a3:
      if (in_RSI == (bitset_t *)0xbb8) {
        bitset_free(pbVar4);
        return;
      }
    }
LAB_001019be:
    test_iterate_cold_3();
  }
  test_iterate_cold_1();
  if ((bitset_t *)in_RSI->array == pbVar16) {
    in_RSI->array = (uint64_t *)((long)&pbVar16->array + 3);
    return;
  }
  increment_cold_1();
  uVar21 = 0;
  pbStack_48 = pbVar4;
  pbVar4 = bitset_create();
  do {
    uVar23 = uVar21 >> 6;
    if ((uVar23 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar23 + 1), _Var3)) {
      pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)uVar21 & 0x3f);
    }
    uVar21 = uVar21 + 3;
  } while (uVar21 != 3000);
  sVar5 = bitset_count(pbVar4);
  if (sVar5 == 1000) {
    lStack_50 = 0;
    if (pbVar4->arraysize != 0) {
      uVar23 = 0;
      uVar21 = 0;
      do {
        unaff_R13 = pbVar4->array[uVar21];
        while (unaff_R13 != 0) {
          uVar14 = 0;
          if (unaff_R13 != 0) {
            for (; (unaff_R13 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
            }
          }
          _Var3 = increment(uVar14 | uVar23,&lStack_50);
          unaff_R13 = unaff_R13 & unaff_R13 - 1;
          if (!_Var3) goto LAB_00101a91;
        }
        uVar23 = uVar23 + 0x40;
        uVar21 = uVar21 + 1;
        unaff_R13 = 0;
      } while (uVar21 < pbVar4->arraysize);
LAB_00101a91:
      if (lStack_50 == 3000) {
        bitset_free(pbVar4);
        return;
      }
    }
    test_iterate2_cold_2();
  }
  test_iterate2_cold_1();
  uVar21 = 0;
  pbVar4 = bitset_create();
  do {
    uVar23 = uVar21 >> 6;
    if ((uVar23 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar23 + 1), _Var3)) {
      pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)uVar21 & 0x3f);
    }
    uVar21 = uVar21 + 3;
  } while (uVar21 != 3000);
  sVar5 = bitset_count(pbVar4);
  if (sVar5 == 1000) {
    sVar8 = 0;
    uVar21 = 0;
    do {
      sVar15 = (short)(((uint)uVar21 & 0xffff) / 3) * 3 + sVar8;
      if (uVar21 >> 6 < pbVar4->arraysize) {
        if ((sVar15 != 0) == ((pbVar4->array[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) {
LAB_00101b79:
          test_construct_cold_2();
          break;
        }
      }
      else if (sVar15 == 0) goto LAB_00101b79;
      uVar21 = uVar21 + 1;
      sVar8 = sVar8 + -1;
      if (uVar21 == 3000) {
        bitset_free(pbVar4);
        return;
      }
    } while( true );
  }
  test_construct_cold_1();
  uVar21 = 300;
  pbVar4 = bitset_create();
  while( true ) {
    uVar23 = uVar21 >> 6;
    if ((uVar23 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar23 + 1), _Var3)) {
      pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)uVar21 & 0x3f);
    }
    sVar5 = bitset_minimum(pbVar4);
    if (sVar5 != 300) break;
    sVar5 = bitset_maximum(pbVar4);
    if (uVar21 != sVar5) {
      test_max_min_cold_2();
      break;
    }
    uVar21 = uVar21 + 3;
    if (uVar21 == 3000) {
      bitset_free(pbVar4);
      return;
    }
  }
  test_max_min_cold_1();
  sVar5 = 0;
  while( true ) {
    uVar21 = 300;
    pbVar4 = bitset_create();
    do {
      uVar23 = uVar21 >> 6;
      if ((uVar23 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar23 + 1), _Var3)) {
        pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)uVar21 & 0x3f);
      }
      uVar21 = uVar21 + 3;
    } while (uVar21 != 15000);
    sVar6 = bitset_count(pbVar4);
    bitset_shift_left(pbVar4,sVar5);
    sVar7 = bitset_count(pbVar4);
    if (sVar7 != sVar6) break;
    lVar10 = 300;
    do {
      uVar21 = sVar5 + lVar10 >> 6;
      if ((pbVar4->arraysize <= uVar21) ||
         ((pbVar4->array[uVar21] >> (sVar5 + lVar10 & 0x3f) & 1) == 0)) {
        test_shift_left_cold_2();
        goto LAB_00101cd8;
      }
      lVar10 = lVar10 + 3;
    } while (lVar10 != 15000);
    bitset_free(pbVar4);
    sVar5 = sVar5 + 1;
    if (sVar5 == 0x100) {
      return;
    }
  }
LAB_00101cd8:
  test_shift_left_cold_1();
  pbVar16 = bitset_create();
  if ((pbVar16->arraysize != 0) || (_Var3 = bitset_grow(pbVar16,1), _Var3)) {
    *pbVar16->array = *pbVar16->array | 2;
  }
  if ((pbVar16->arraysize != 0) || (_Var3 = bitset_grow(pbVar16,1), _Var3)) {
    *pbVar16->array = *pbVar16->array & 0xfffffffffffffffd;
  }
  if ((pbVar16->arraysize != 0) || (_Var3 = bitset_grow(pbVar16,1), _Var3)) {
    *pbVar16->array = *pbVar16->array & 0xfffffffffffffbff;
  }
  if ((pbVar16->arraysize != 0) || (_Var3 = bitset_grow(pbVar16,1), _Var3)) {
    *pbVar16->array = *pbVar16->array | 0x400;
  }
  if ((pbVar16->arraysize == 0) || (((uint)*pbVar16->array >> 10 & 1) == 0)) {
    test_set_to_val_cold_2();
  }
  else if ((*pbVar16->array & 2) == 0) {
    bitset_free(pbVar16);
    return;
  }
  test_set_to_val_cold_1();
  lVar10 = 0;
  lVar20 = 0;
  sStack_f0 = 0;
  pbStack_e8 = pbVar16;
  uStack_e0 = uVar23;
  uStack_d8 = unaff_R13;
  pbStack_d0 = pbVar4;
  sStack_c8 = sVar6;
  do {
    lVar13 = 300;
    pcStack_f8 = (code *)0x101db3;
    pbVar4 = bitset_create();
    do {
      uVar21 = (ulong)(lVar20 + lVar13) >> 6;
      if (uVar21 < pbVar4->arraysize) {
LAB_00101dd9:
        pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)(lVar20 + lVar13) & 0x3f);
      }
      else {
        pcStack_f8 = (code *)0x101dd5;
        _Var3 = bitset_grow(pbVar4,uVar21 + 1);
        if (_Var3) goto LAB_00101dd9;
      }
      lVar13 = lVar13 + 3;
    } while (lVar13 != 0x3bc4);
    pcStack_f8 = (code *)0x101dff;
    sVar6 = bitset_count(pbVar4);
    sVar5 = sStack_f0;
    pcStack_f8 = (code *)0x101e11;
    bitset_shift_right(pbVar4,sStack_f0);
    pcStack_f8 = (code *)0x101e19;
    sVar7 = bitset_count(pbVar4);
    if (sVar7 != sVar6) {
LAB_00101e85:
      pcStack_f8 = test_union_intersection;
      test_shift_right_cold_1();
      sStack_118 = sVar5;
      pcStack_120 = (code *)0x101e98;
      lStack_110 = lVar10;
      lStack_108 = lVar20;
      pbStack_100 = pbVar4;
      pcStack_f8 = (code *)sVar6;
      pbVar4 = bitset_create();
      lVar10 = 0;
      pcStack_120 = (code *)0x101ea3;
      pbVar16 = bitset_create();
      uVar21 = 0;
      break;
    }
    lVar11 = 300;
    do {
      uVar21 = (ulong)(lVar10 + lVar11) >> 6;
      if ((pbVar4->arraysize <= uVar21) ||
         ((pbVar4->array[uVar21] >> (lVar10 + lVar11 & 0x3fU) & 1) == 0)) {
        pcStack_f8 = (code *)0x101e85;
        test_shift_right_cold_2();
        goto LAB_00101e85;
      }
      lVar11 = lVar11 + 3;
    } while (lVar11 != 0x3bc4);
    pcStack_f8 = (code *)0x101e59;
    bitset_free(pbVar4);
    sStack_f0 = sVar5 + 1;
    lVar20 = lVar20 + 3;
    lVar10 = lVar10 + 2;
    if (sStack_f0 == 0x100) {
      return;
    }
  } while( true );
  while( true ) {
    uVar21 = uVar21 + 1;
    lVar10 = lVar10 + 2;
    if (uVar21 == 1000) break;
    uVar23 = uVar21 >> 5;
    if (uVar23 < pbVar4->arraysize) {
LAB_00101ec6:
      pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)lVar10 & 0x3e);
    }
    else {
      pcStack_120 = (code *)0x101ec2;
      _Var3 = bitset_grow(pbVar4,uVar23 + 1);
      if (_Var3) goto LAB_00101ec6;
    }
    if (uVar23 < pbVar16->arraysize) {
LAB_00101ef1:
      pbVar16->array[uVar23] = pbVar16->array[uVar23] | 2L << ((byte)lVar10 & 0x3e);
    }
    else {
      pcStack_120 = (code *)0x101eed;
      _Var3 = bitset_grow(pbVar16,uVar23 + 1);
      if (_Var3) goto LAB_00101ef1;
    }
  }
  pcStack_120 = (code *)0x101f21;
  bitset_inplace_symmetric_difference(pbVar4,pbVar16);
  pcStack_120 = (code *)0x101f29;
  sVar5 = bitset_count(pbVar4);
  if (sVar5 == 2000) {
    pcStack_120 = (code *)0x101f40;
    bitset_inplace_symmetric_difference(pbVar4,pbVar16);
    pcStack_120 = (code *)0x101f48;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 1000) goto LAB_00102002;
    pcStack_120 = (code *)0x101f5f;
    bitset_inplace_difference(pbVar4,pbVar16);
    pcStack_120 = (code *)0x101f67;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 1000) goto LAB_00102007;
    pcStack_120 = (code *)0x101f7e;
    bitset_inplace_union(pbVar4,pbVar16);
    pcStack_120 = (code *)0x101f86;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 2000) goto LAB_0010200c;
    pcStack_120 = (code *)0x101f99;
    bitset_inplace_intersection(pbVar4,pbVar16);
    pcStack_120 = (code *)0x101fa1;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 1000) goto LAB_00102011;
    pcStack_120 = (code *)0x101fb4;
    bitset_inplace_difference(pbVar4,pbVar16);
    pcStack_120 = (code *)0x101fbc;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 0) goto LAB_00102016;
    pcStack_120 = (code *)0x101fcc;
    bitset_inplace_union(pbVar4,pbVar16);
    pcStack_120 = (code *)0x101fd7;
    bitset_inplace_difference(pbVar16,pbVar4);
    pcStack_120 = (code *)0x101fdf;
    sVar5 = bitset_count(pbVar16);
    if (sVar5 == 0) {
      pcStack_120 = (code *)0x101fec;
      bitset_free(pbVar4);
      bitset_free(pbVar16);
      return;
    }
  }
  else {
    pcStack_120 = (code *)0x102002;
    test_union_intersection_cold_1();
LAB_00102002:
    pcStack_120 = (code *)0x102007;
    test_union_intersection_cold_2();
LAB_00102007:
    pcStack_120 = (code *)0x10200c;
    test_union_intersection_cold_3();
LAB_0010200c:
    pcStack_120 = (code *)0x102011;
    test_union_intersection_cold_4();
LAB_00102011:
    pcStack_120 = (code *)0x102016;
    test_union_intersection_cold_5();
LAB_00102016:
    pcStack_120 = (code *)0x10201b;
    test_union_intersection_cold_6();
  }
  pcStack_120 = test_counts;
  test_union_intersection_cold_7();
  pcStack_158 = (code *)0x102030;
  pbStack_148 = pbVar4;
  uStack_140 = uVar21;
  uStack_138 = uVar23;
  pbStack_130 = pbVar16;
  lStack_128 = lVar10;
  pcStack_120 = (code *)lVar13;
  pbVar4 = bitset_create();
  lVar10 = 0;
  pcStack_158 = (code *)0x10203b;
  pbVar16 = bitset_create();
  uVar23 = 0;
  uVar21 = 0;
  do {
    uVar14 = uVar21 >> 5;
    if (uVar14 < pbVar4->arraysize) {
LAB_00102061:
      pbVar4->array[uVar14] = pbVar4->array[uVar14] | 1L << ((byte)lVar10 & 0x3e);
    }
    else {
      pcStack_158 = (code *)0x10205d;
      _Var3 = bitset_grow(pbVar4,uVar14 + 1);
      if (_Var3) goto LAB_00102061;
    }
    uVar14 = uVar23 >> 6;
    if (uVar14 < pbVar16->arraysize) {
LAB_00102093:
      pbVar16->array[uVar14] = pbVar16->array[uVar14] | 1L << ((byte)uVar23 & 0x3f);
    }
    else {
      pcStack_158 = (code *)0x10208f;
      _Var3 = bitset_grow(pbVar16,uVar14 + 1);
      if (_Var3) goto LAB_00102093;
    }
    uVar21 = uVar21 + 1;
    uVar23 = uVar23 + 3;
    lVar10 = lVar10 + 2;
  } while (uVar21 != 1000);
  pcStack_158 = (code *)0x1020c4;
  sVar5 = bitset_intersection_count(pbVar4,pbVar16);
  if (sVar5 == 0x14e) {
    pcStack_158 = (code *)0x1020d7;
    sVar5 = bitset_union_count(pbVar4,pbVar16);
    if (sVar5 == 0x682) {
      pcStack_158 = (code *)0x1020e7;
      bitset_free(pbVar4);
      bitset_free(pbVar16);
      return;
    }
  }
  else {
    pcStack_158 = (code *)0x102102;
    test_counts_cold_1();
  }
  pcStack_158 = test_disjoint;
  test_counts_cold_2();
  pcStack_180 = (code *)0x102115;
  pbStack_178 = pbVar4;
  lStack_170 = lVar10;
  uStack_168 = uVar21;
  pbStack_160 = pbVar16;
  pcStack_158 = (code *)uVar23;
  pbVar4 = bitset_create();
  uVar21 = 0;
  pcStack_180 = (code *)0x102120;
  pbVar16 = bitset_create();
  do {
    uVar23 = uVar21 >> 6;
    if ((uVar21 & 1) == 0) {
      uVar14 = 0x3e;
      pbVar12 = pbVar4;
      if (uVar23 < pbVar4->arraysize) goto LAB_00102176;
      pcStack_180 = (code *)0x10215e;
      _Var3 = bitset_grow(pbVar4,uVar23 + 1);
LAB_00102172:
      if (_Var3 != false) goto LAB_00102176;
    }
    else {
      uVar14 = 0x3f;
      pbVar12 = pbVar16;
      if (pbVar16->arraysize <= uVar23) {
        pcStack_180 = (code *)0x10216f;
        _Var3 = bitset_grow(pbVar16,uVar23 + 1);
        goto LAB_00102172;
      }
LAB_00102176:
      uVar22 = (uint)uVar14 & (uint)uVar21;
      uVar14 = (ulong)uVar22;
      pbVar12->array[uVar23] = pbVar12->array[uVar23] | 1L << (sbyte)uVar22;
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != 1000);
  pcStack_180 = (code *)0x1021a2;
  _Var3 = bitsets_disjoint(pbVar4,pbVar16);
  if (_Var3) {
    uVar14 = 0x20000000000000;
    if (pbVar4->arraysize < 8) {
      pcStack_180 = (code *)0x1021c4;
      _Var3 = bitset_grow(pbVar4,8);
      if (_Var3) goto LAB_001021c8;
    }
    else {
LAB_001021c8:
      pbVar4->array[7] = pbVar4->array[7] | 0x20000000000000;
    }
    if (pbVar16->arraysize < 8) {
      pcStack_180 = (code *)0x1021e3;
      _Var3 = bitset_grow(pbVar16,8);
      if (_Var3) goto LAB_001021e7;
    }
    else {
LAB_001021e7:
      pbVar16->array[7] = pbVar16->array[7] | 0x20000000000000;
    }
    pcStack_180 = (code *)0x1021f9;
    _Var3 = bitsets_disjoint(pbVar4,pbVar16);
    if (!_Var3) {
      pcStack_180 = (code *)0x102205;
      bitset_free(pbVar4);
      bitset_free(pbVar16);
      return;
    }
  }
  else {
    pcStack_180 = (code *)0x10221b;
    test_disjoint_cold_1();
  }
  pcStack_180 = test_intersects;
  test_disjoint_cold_2();
  pbStack_1a8 = (bitset_t *)0x10222e;
  pbStack_1a0 = pbVar4;
  uStack_198 = uVar21;
  uStack_190 = uVar23;
  pbStack_188 = pbVar16;
  pcStack_180 = (code *)uVar14;
  pbVar4 = bitset_create();
  pbStack_1a8 = (bitset_t *)0x102236;
  pbVar16 = bitset_create();
  pbStack_1a8 = (bitset_t *)0x102241;
  _Var3 = bitset_empty(pbVar4);
  if (_Var3) {
    uVar21 = 0;
    do {
      uVar23 = uVar21 >> 6;
      if ((uVar21 & 1) == 0) {
        uVar14 = 0x3e;
        pbVar12 = pbVar4;
        if (uVar23 < pbVar4->arraysize) goto LAB_0010229f;
        pbStack_1a8 = (bitset_t *)0x102287;
        _Var3 = bitset_grow(pbVar4,uVar23 + 1);
LAB_0010229b:
        if (_Var3 != false) goto LAB_0010229f;
      }
      else {
        uVar14 = 0x3f;
        pbVar12 = pbVar16;
        if (pbVar16->arraysize <= uVar23) {
          pbStack_1a8 = (bitset_t *)0x102298;
          _Var3 = bitset_grow(pbVar16,uVar23 + 1);
          goto LAB_0010229b;
        }
LAB_0010229f:
        uVar22 = (uint)uVar14 & (uint)uVar21;
        uVar14 = (ulong)uVar22;
        pbVar12->array[uVar23] = pbVar12->array[uVar23] | 1L << (sbyte)uVar22;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != 1000);
    pbStack_1a8 = (bitset_t *)0x1022cb;
    _Var3 = bitsets_intersect(pbVar4,pbVar16);
    if (_Var3) goto LAB_00102344;
    uVar14 = 0x20000000000;
    if (pbVar4->arraysize < 0x10) {
      pbStack_1a8 = (bitset_t *)0x1022ed;
      _Var3 = bitset_grow(pbVar4,0x10);
      if (_Var3) goto LAB_001022f1;
    }
    else {
LAB_001022f1:
      pbVar4->array[0xf] = pbVar4->array[0xf] | 0x20000000000;
    }
    if (pbVar16->arraysize < 0x10) {
      pbStack_1a8 = (bitset_t *)0x10230c;
      _Var3 = bitset_grow(pbVar16,0x10);
      if (_Var3) goto LAB_00102310;
    }
    else {
LAB_00102310:
      pbVar16->array[0xf] = pbVar16->array[0xf] | 0x20000000000;
    }
    pbStack_1a8 = (bitset_t *)0x102322;
    _Var3 = bitsets_intersect(pbVar4,pbVar16);
    if (_Var3) {
      pbStack_1a8 = (bitset_t *)0x10232e;
      bitset_free(pbVar4);
      bitset_free(pbVar16);
      return;
    }
  }
  else {
    pbStack_1a8 = (bitset_t *)0x102344;
    test_intersects_cold_1();
LAB_00102344:
    pbStack_1a8 = (bitset_t *)0x102349;
    test_intersects_cold_3();
  }
  pbStack_1a8 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_1c0 = (code *)0x10235c;
  pbStack_1b0 = pbVar4;
  pbStack_1a8 = pbVar16;
  pbVar4 = bitset_create_with_capacity(10);
  pcStack_1c0 = (code *)0x102369;
  pbVar16 = bitset_create_with_capacity(5);
  if (pbVar4->arraysize == 0) {
    pcStack_1c0 = (code *)0x102380;
    _Var3 = bitset_grow(pbVar4,1);
    if (_Var3) goto LAB_00102384;
  }
  else {
LAB_00102384:
    *pbVar4->array = *pbVar4->array | 2;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_1c0 = (code *)0x10239f;
    _Var3 = bitset_grow(pbVar4,1);
    if (_Var3) goto LAB_001023a3;
  }
  else {
LAB_001023a3:
    *pbVar4->array = *pbVar4->array | 0x10;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_1c0 = (code *)0x1023be;
    _Var3 = bitset_grow(pbVar4,1);
    if (_Var3) goto LAB_001023c2;
  }
  else {
LAB_001023c2:
    *pbVar4->array = *pbVar4->array | 0x40;
  }
  if (pbVar16->arraysize == 0) {
    pcStack_1c0 = (code *)0x1023dd;
    _Var3 = bitset_grow(pbVar16,1);
    if (_Var3) goto LAB_001023e1;
  }
  else {
LAB_001023e1:
    *pbVar16->array = *pbVar16->array | 2;
  }
  if (pbVar16->arraysize == 0) {
    pcStack_1c0 = (code *)0x1023fc;
    _Var3 = bitset_grow(pbVar16,1);
    if (_Var3) goto LAB_00102400;
  }
  else {
LAB_00102400:
    *pbVar16->array = *pbVar16->array | 0x10;
  }
  pcStack_1c0 = (code *)0x102412;
  _Var3 = bitset_contains_all(pbVar4,pbVar16);
  if (_Var3) {
    pcStack_1c0 = (code *)0x102421;
    _Var3 = bitset_contains_all(pbVar16,pbVar4);
    if (!_Var3) {
      pcStack_1c0 = (code *)0x10242d;
      bitset_free(pbVar4);
      bitset_free(pbVar16);
      return;
    }
  }
  else {
    pcStack_1c0 = (code *)0x102441;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_1c0 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_1e8 = (code *)0x102453;
  pbStack_1d8 = pbVar4;
  uStack_1d0 = 1000;
  pbStack_1c8 = pbVar16;
  pcStack_1c0 = (code *)uVar14;
  pbVar4 = bitset_create();
  uVar21 = 0;
  pcStack_1e8 = (code *)0x10245e;
  pbVar16 = bitset_create();
  do {
    uVar23 = uVar21 >> 6;
    if (uVar23 < pbVar4->arraysize) {
LAB_0010247f:
      pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)uVar21 & 0x3f);
    }
    else {
      pcStack_1e8 = (code *)0x10247b;
      _Var3 = bitset_grow(pbVar4,uVar23 + 1);
      if (_Var3) goto LAB_0010247f;
    }
    if ((uVar21 & 1) == 0) {
      if (pbVar16->arraysize <= uVar23) {
        pcStack_1e8 = (code *)0x1024aa;
        _Var3 = bitset_grow(pbVar16,uVar23 + 1);
        if (!_Var3) goto LAB_001024c3;
      }
      pbVar16->array[uVar23] = pbVar16->array[uVar23] | 1L << ((byte)uVar21 & 0x3e);
    }
LAB_001024c3:
    uVar21 = uVar21 + 1;
  } while (uVar21 != 1000);
  pcStack_1e8 = (code *)0x1024da;
  _Var3 = bitset_contains_all(pbVar4,pbVar16);
  if (_Var3) {
    pcStack_1e8 = (code *)0x1024e9;
    _Var3 = bitset_contains_all(pbVar16,pbVar4);
    if (_Var3) goto LAB_00102554;
    if (pbVar16->arraysize < 0x10) {
      pcStack_1e8 = (code *)0x102501;
      _Var3 = bitset_grow(pbVar16,0x10);
      if (_Var3) goto LAB_00102505;
    }
    else {
LAB_00102505:
      pbVar16->array[0xf] = pbVar16->array[0xf] | 0x20000000000;
    }
    pcStack_1e8 = (code *)0x102521;
    _Var3 = bitset_contains_all(pbVar4,pbVar16);
    if (!_Var3) {
      pcStack_1e8 = (code *)0x102530;
      _Var3 = bitset_contains_all(pbVar16,pbVar4);
      if (!_Var3) {
        pcStack_1e8 = (code *)0x10253c;
        bitset_free(pbVar4);
        bitset_free(pbVar16);
        return;
      }
      goto LAB_0010255e;
    }
  }
  else {
    pcStack_1e8 = (code *)0x102554;
    test_contains_all_cold_1();
LAB_00102554:
    pcStack_1e8 = (code *)0x102559;
    test_contains_all_cold_4();
  }
  pcStack_1e8 = (code *)0x10255e;
  test_contains_all_cold_3();
LAB_0010255e:
  pcStack_1e8 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar23 = 0;
  pbStack_1f8 = pbVar4;
  pbStack_1f0 = pbVar16;
  pcStack_1e8 = (code *)uVar21;
  pbVar4 = bitset_create();
  do {
    uVar21 = uVar23 >> 6;
    if (uVar21 < pbVar4->arraysize) {
LAB_00102594:
      pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)uVar23 & 0x3f);
    }
    else {
      _Var3 = bitset_grow(pbVar4,uVar21 + 1);
      if (_Var3) goto LAB_00102594;
    }
    uVar23 = uVar23 + 1;
  } while (uVar23 != 100);
  uVar21 = 0x3e6;
  do {
    uVar21 = uVar21 + 2;
    uVar23 = uVar21 >> 6;
    if (uVar23 < pbVar4->arraysize) {
LAB_001025d6:
      pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)uVar21 & 0x3e);
    }
    else {
      _Var3 = bitset_grow(pbVar4,uVar23 + 1);
      if (_Var3) goto LAB_001025d6;
    }
  } while (uVar21 < 0x44a);
  uVar21 = pbVar4->arraysize;
  if (uVar21 != 0) {
    puVar2 = pbVar4->array;
    uVar14 = 0;
    uVar23 = 0;
    lVar10 = 0;
    do {
      uVar19 = (puVar2[uVar14] >> ((byte)uVar23 & 0x3f)) << ((byte)uVar23 & 0x3f);
      uVar23 = uVar23 & 0xffffffffffffffc0;
      uVar17 = 0;
      do {
        while (uVar19 == 0) {
          uVar14 = uVar14 + 1;
          if (uVar14 == uVar21) {
            lVar20 = lVar10;
            if (uVar17 == 0) goto LAB_001026ac;
            goto LAB_0010265a;
          }
          uVar23 = uVar23 + 0x40;
          uVar19 = puVar2[uVar14];
          if (2 < uVar17) goto LAB_0010265a;
        }
        uVar18 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        auStack_220[uVar17 + 1] = uVar18 | uVar23;
        uVar17 = uVar17 + 1;
        uVar19 = uVar19 & uVar19 - 1;
      } while (uVar17 != 3);
      uVar17 = 3;
LAB_0010265a:
      lVar20 = lVar10 + uVar17;
      uVar23 = lVar10 * 2 + 800;
      uVar14 = 0;
      do {
        uVar18 = lVar10 + uVar14;
        if (99 < lVar10 + uVar14) {
          uVar18 = uVar23;
        }
        if (auStack_220[uVar14 + 1] != uVar18) {
          test_next_bits_iterate_cold_1();
          goto LAB_001026ce;
        }
        uVar14 = uVar14 + 1;
        uVar23 = uVar23 + 2;
      } while (uVar17 != uVar14);
      uVar23 = auStack_220[uVar17] + 1;
      uVar14 = uVar23 >> 6;
      lVar10 = lVar20;
    } while (uVar14 < uVar21);
LAB_001026ac:
    if (lVar20 == 0x96) {
      bitset_free(pbVar4);
      return;
    }
  }
LAB_001026ce:
  test_next_bits_iterate_cold_2();
  uVar21 = 0;
  pbVar4 = bitset_create();
  do {
    uVar23 = uVar21 >> 6;
    if ((uVar23 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar23 + 1), _Var3)) {
      pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)uVar21 & 0x3f);
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != 100);
  uVar21 = 0x3e6;
  do {
    uVar21 = uVar21 + 2;
    uVar23 = uVar21 >> 6;
    if ((uVar23 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar23 + 1), _Var3)) {
      pbVar4->array[uVar23] = pbVar4->array[uVar23] | 1L << ((byte)uVar21 & 0x3e);
    }
  } while (uVar21 < 0x44a);
  uVar21 = pbVar4->arraysize;
  if (uVar21 != 0) {
    uVar17 = 0;
    uVar14 = 0;
    uVar23 = 0;
    do {
      uVar18 = pbVar4->array[uVar17] >> ((byte)uVar23 & 0x3f);
      if (uVar18 == 0) {
        lVar10 = uVar17 * -0x40;
        do {
          uVar17 = uVar17 + 1;
          if (uVar21 == uVar17) goto LAB_001027db;
          uVar23 = pbVar4->array[uVar17];
          lVar10 = lVar10 + -0x40;
        } while (uVar23 == 0);
        lVar20 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
          }
        }
        uVar23 = lVar20 - lVar10;
      }
      else {
        lVar10 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        uVar23 = uVar23 + lVar10;
      }
      uVar17 = uVar14 * 2 + 800;
      if (uVar14 < 100) {
        uVar17 = uVar14;
      }
      if (uVar23 != uVar17) {
        test_next_bit_iterate_cold_1();
        goto LAB_001027f9;
      }
      uVar14 = uVar14 + 1;
      uVar23 = uVar23 + 1;
      uVar17 = uVar23 >> 6;
    } while (uVar17 < uVar21);
LAB_001027db:
    if (uVar14 == 0x96) {
      bitset_free(pbVar4);
      return;
    }
  }
LAB_001027f9:
  test_next_bit_iterate_cold_2();
  test_next_bit_iterate();
  test_next_bits_iterate();
  test_set_to_val();
  test_construct();
  test_union_intersection();
  test_iterate();
  test_iterate2();
  test_max_min();
  test_counts();
  test_shift_right();
  test_shift_left();
  test_disjoint();
  test_intersects();
  test_contains_all();
  test_contains_all_different_sizes();
  puts("All TEST_ASSERTs passed. Code is probably ok.");
  return;
}

Assistant:

void test_iterate() {
  bitset_t *b = bitset_create();
  for (int k = 0; k < 1000; ++k)
    bitset_set(b, 3 * k);
  TEST_ASSERT(bitset_count(b) == 1000);
  size_t k = 0;
  for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
    TEST_ASSERT(i == k);
    k += 3;
  }
  TEST_ASSERT(k == 3000);
  bitset_free(b);
}